

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall
wasm_exporttype_t::wasm_exporttype_t(wasm_exporttype_t *this,wasm_exporttype_t *other)

{
  ExportType local_40;
  wasm_exporttype_t *local_18;
  wasm_exporttype_t *other_local;
  wasm_exporttype_t *this_local;
  
  local_18 = other;
  other_local = this;
  wabt::interp::ExportType::ExportType(&local_40,&other->I);
  wasm_exporttype_t(this,&local_40);
  wabt::interp::ExportType::~ExportType(&local_40);
  return;
}

Assistant:

wasm_exporttype_t(const wasm_exporttype_t& other)
      : wasm_exporttype_t(other.I) {}